

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void Memory::
     DeleteObject<Memory::Recycler,(Memory::AllocatorDeleteFlags)0,JsUtil::List<Js::FunctionBody::StatementAdjustmentRecord,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>>
               (AllocatorType *allocator,
               List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
               *obj)

{
  (*(obj->
    super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
    )._vptr_ReadOnlyList[2])(obj);
  Recycler::ExplicitFreeNonLeaf(allocator,obj,0x30);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj)
{
    obj->~T();

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size());
}